

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O0

Var __thiscall BailoutConstantValue::ToVar(BailoutConstantValue *this,Func *func)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  anon_union_8_3_5e50e90d_for_u local_20;
  Var varValue;
  Func *func_local;
  BailoutConstantValue *this_local;
  
  if (((this->type != TyVar) && (this->type != TyFloat64)) &&
     (bVar2 = IRType_IsSignedInt(this->type), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                       ,0x25,
                       "(this->type == TyVar || this->type == TyFloat64 || IRType_IsSignedInt(this->type))"
                       ,
                       "this->type == TyVar || this->type == TyFloat64 || IRType_IsSignedInt(this->type)"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->type == TyVar) {
    local_20 = this->u;
  }
  else if (this->type == TyFloat64) {
    local_20 = (anon_union_8_3_5e50e90d_for_u)Func::AllocateNumber(func,(double)this->u);
  }
  else {
    bVar2 = IRType_IsSignedInt(this->type);
    if (((!bVar2) || (4 < TySize[this->type])) ||
       (bVar2 = Js::TaggedInt::IsOverflow((int32)(this->u).intConst.value), bVar2)) {
      local_20 = (anon_union_8_3_5e50e90d_for_u)Func::AllocateNumber(func,(double)(long)this->u);
    }
    else {
      local_20 = (anon_union_8_3_5e50e90d_for_u)
                 Js::TaggedInt::ToVarUnchecked((int)(this->u).intConst.value);
    }
  }
  return (Var)local_20;
}

Assistant:

Js::Var BailoutConstantValue::ToVar(Func* func) const
{
    Assert(this->type == TyVar || this->type == TyFloat64 || IRType_IsSignedInt(this->type));
    Js::Var varValue;
    if (this->type == TyVar)
    {
        varValue = this->u.varConst.value;
    }
    else if (this->type == TyFloat64)
    {
        varValue = func->AllocateNumber((double)this->u.floatConst.value);
    }
    else if (IRType_IsSignedInt(this->type) && TySize[this->type] <= 4 && !Js::TaggedInt::IsOverflow((int32)this->u.intConst.value))
    {
        varValue = Js::TaggedInt::ToVarUnchecked((int32)this->u.intConst.value);
    }
    else
    {
        varValue = func->AllocateNumber((double)this->u.intConst.value);
    }
    return varValue;

}